

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>> *this,FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *x)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  Fad<Fad<double>_> *pFVar6;
  void *pvVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  value_type local_60;
  Fad<Fad<double>_> *local_40;
  long local_38;
  
  uVar1 = (((x->fadexpr_).left_)->dx_).num_elts;
  uVar11 = (ulong)uVar1;
  local_40 = (Fad<Fad<double>_> *)this;
  if (uVar11 != 0) {
    uVar2 = *(uint *)(this + 0x28);
    if ((ulong)uVar2 == 0) {
      Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),uVar1);
      pdVar8 = *(double **)(this + 0x30);
      if ((((x->fadexpr_).left_)->dx_).num_elts == 0) {
        if (0 < (int)uVar1) {
          uVar9 = 0;
          do {
            FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx(&local_60,&x->fadexpr_,(int)uVar9);
            *pdVar8 = local_60.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar8 + 1),&local_60.dx_);
            pdVar8[3] = local_60.defaultVal;
            Fad<double>::~Fad(&local_60);
            uVar9 = uVar9 + 1;
            pdVar8 = pdVar8 + 4;
          } while (uVar11 != uVar9);
        }
      }
      else if (0 < (int)uVar1) {
        uVar9 = 0;
        do {
          FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                    (&local_60,&x->fadexpr_,(int)uVar9);
          *pdVar8 = local_60.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar8 + 1),&local_60.dx_);
          pdVar8[3] = local_60.defaultVal;
          Fad<double>::~Fad(&local_60);
          uVar9 = uVar9 + 1;
          pdVar8 = pdVar8 + 4;
        } while (uVar11 != uVar9);
      }
    }
    else if (0 < (int)uVar2) {
      local_38 = *(long *)(this + 0x30);
      uVar11 = 0;
      do {
        FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                  (&local_60,&x->fadexpr_,(int)uVar11);
        pdVar5 = local_60.dx_.ptr_to_data;
        iVar4 = local_60.dx_.num_elts;
        pdVar8 = (double *)(local_38 + uVar11 * 0x20);
        uVar9 = (ulong)(uint)local_60.dx_.num_elts;
        if (uVar9 != 0) {
          uVar1 = *(uint *)(local_38 + 8 + uVar11 * 0x20);
          if ((ulong)uVar1 == 0) {
            *(int *)(pdVar8 + 1) = local_60.dx_.num_elts;
            uVar10 = uVar9 * 8;
            if (local_60.dx_.num_elts < 0) {
              uVar10 = 0xffffffffffffffff;
            }
            pvVar7 = operator_new__(uVar10);
            pdVar8[2] = (double)pvVar7;
            if (0 < iVar4) {
              uVar10 = 0;
              do {
                *(double *)((long)pvVar7 + uVar10 * 8) = pdVar5[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
          }
          else if (0 < (int)uVar1) {
            dVar3 = pdVar8[2];
            uVar9 = 0;
            do {
              *(double *)((long)dVar3 + uVar9 * 8) =
                   local_60.dx_.ptr_to_data[uVar9] + *(double *)((long)dVar3 + uVar9 * 8);
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
        }
        *pdVar8 = local_60.val_ + *pdVar8;
        Fad<double>::~Fad(&local_60);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar2);
    }
  }
  FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_60,&x->fadexpr_);
  pFVar6 = local_40;
  uVar11 = (ulong)(uint)local_60.dx_.num_elts;
  if (uVar11 != 0) {
    uVar1 = (local_40->val_).dx_.num_elts;
    if ((ulong)uVar1 == 0) {
      (local_40->val_).dx_.num_elts = local_60.dx_.num_elts;
      uVar9 = 0xffffffffffffffff;
      if (-1 < local_60.dx_.num_elts) {
        uVar9 = uVar11 * 8;
      }
      pdVar8 = (double *)operator_new__(uVar9);
      (pFVar6->val_).dx_.ptr_to_data = pdVar8;
      if (0 < local_60.dx_.num_elts) {
        uVar9 = 0;
        do {
          pdVar8[uVar9] = local_60.dx_.ptr_to_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar8 = (local_40->val_).dx_.ptr_to_data;
      uVar11 = 0;
      do {
        pdVar8[uVar11] = local_60.dx_.ptr_to_data[uVar11] + pdVar8[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
  }
  (pFVar6->val_).val_ = local_60.val_ + (pFVar6->val_).val_;
  Fad<double>::~Fad(&local_60);
  return pFVar6;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}